

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::addClause_(SimpSolver *this,vec<Glucose::Lit> *ps)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  bool bVar7;
  undefined8 in_RAX;
  uint uVar8;
  long lVar9;
  CRef cr;
  undefined8 uStack_38;
  
  iVar2 = (this->super_Solver).clauses.sz;
  uStack_38 = in_RAX;
  if ((this->use_rcheck == true) && (bVar7 = implied(this,ps), bVar7)) {
    return true;
  }
  bVar7 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar7) {
    if ((this->parsing == 0) && ((this->super_Solver).certifiedUNSAT == true)) {
      if ((this->super_Solver).vbyte == false) {
        if (0 < ps->sz) {
          lVar9 = 0;
          do {
            uVar4 = ps->data[lVar9].x;
            uVar8 = (int)uVar4 >> 1;
            uVar6 = ~uVar8;
            if ((uVar4 & 1) == 0) {
              uVar6 = uVar8 + 1;
            }
            fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar6);
            lVar9 = lVar9 + 1;
          } while (lVar9 < ps->sz);
        }
        fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
      }
      else {
        Solver::write_char(&this->super_Solver,'a');
        if (0 < ps->sz) {
          lVar9 = 0;
          do {
            Solver::write_lit(&this->super_Solver,ps->data[lVar9].x + 2);
            lVar9 = lVar9 + 1;
          } while (lVar9 < ps->sz);
        }
        Solver::write_lit(&this->super_Solver,0);
      }
    }
    bVar7 = true;
    if ((this->use_simplification == true) &&
       (iVar3 = (this->super_Solver).clauses.sz, iVar3 == iVar2 + 1)) {
      uVar4 = (this->super_Solver).clauses.data[(long)iVar3 + -1];
      uStack_38 = CONCAT44(uVar4,(undefined4)uStack_38);
      puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      Queue<unsigned_int>::insert(&this->subsumption_queue,uVar4);
      if (0 < (int)puVar5[(ulong)uVar4 + 1]) {
        lVar9 = 0;
        do {
          vec<unsigned_int>::push
                    ((this->occurs).occs.data + ((int)puVar5[(ulong)uVar4 + lVar9 + 3] >> 1),
                     (uint *)((long)&uStack_38 + 4));
          piVar1 = (this->n_occ).data + (int)puVar5[(ulong)uVar4 + lVar9 + 3];
          *piVar1 = *piVar1 + 1;
          (this->touched).data[(int)puVar5[(ulong)uVar4 + lVar9 + 3] >> 1] = '\x01';
          this->n_touched = this->n_touched + 1;
          if (((int)puVar5[(ulong)uVar4 + lVar9 + 3] >> 1 < (this->elim_heap).indices.sz) &&
             (iVar2 = (this->elim_heap).indices.data[(int)puVar5[(ulong)uVar4 + lVar9 + 3] >> 1],
             -1 < iVar2)) {
            Heap<Glucose::SimpSolver::ElimLt>::percolateDown(&this->elim_heap,iVar2);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)puVar5[(ulong)uVar4 + 1]);
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif
    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if(!parsing && certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < ps.size(); i++)
                write_lit(2*(var(ps[i])+1) + sign(ps[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[toInt(c[i])]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}